

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.c
# Opt level: O0

bool_t prf_material_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  ushort uVar1;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict6 *data;
  int pos;
  float32_t in_stack_ffffffffffffffcc;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar2;
  
  if (*in_RDI == prf_material_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    uVar1 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    if (7 < in_RDI[1]) {
      bf_put_uint32_be(bfile_00,(uint32_t)in_stack_ffffffffffffffcc);
      uVar1 = 8;
      if (0x13 < in_RDI[1]) {
        bf_write(unaff_retaddr,
                 (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                 (uint)((ulong)in_RDI >> 0x20));
        uVar1 = 0x14;
        if (0x17 < in_RDI[1]) {
          bf_put_uint32_be(bfile_00,(uint32_t)in_stack_ffffffffffffffcc);
          uVar1 = 0x18;
          if (0x1b < in_RDI[1]) {
            bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
            uVar1 = 0x1c;
            if (0x1f < in_RDI[1]) {
              bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
              uVar1 = 0x20;
              if (0x23 < in_RDI[1]) {
                bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                uVar1 = 0x24;
                if (0x27 < in_RDI[1]) {
                  bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                  uVar1 = 0x28;
                  if (0x2b < in_RDI[1]) {
                    bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                    uVar1 = 0x2c;
                    if (0x2f < in_RDI[1]) {
                      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                      uVar1 = 0x30;
                      if (0x33 < in_RDI[1]) {
                        bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                        uVar1 = 0x34;
                        if (0x37 < in_RDI[1]) {
                          bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                          uVar1 = 0x38;
                          if (0x3b < in_RDI[1]) {
                            bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                            uVar1 = 0x3c;
                            if (0x3f < in_RDI[1]) {
                              bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                              uVar1 = 0x40;
                              if (0x43 < in_RDI[1]) {
                                bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                                uVar1 = 0x44;
                                if (0x47 < in_RDI[1]) {
                                  bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                                  uVar1 = 0x48;
                                  if (0x4b < in_RDI[1]) {
                                    bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                                    uVar1 = 0x4c;
                                    if (0x4f < in_RDI[1]) {
                                      bf_put_float32_be(bfile_00,in_stack_ffffffffffffffcc);
                                      uVar1 = 0x50;
                                      if (0x53 < in_RDI[1]) {
                                        bf_put_uint32_be(bfile_00,(uint32_t)
                                                                  in_stack_ffffffffffffffcc);
                                        uVar1 = 0x54;
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if (uVar1 < in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar2 = 1;
  }
  else {
    prf_error(9,"tried using material save method for node of type %d.",(ulong)*in_RDI);
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

static
bool_t
prf_material_save_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    if ( node->opcode != prf_material_info.opcode ) {
        prf_error( 9, "tried using material save method for node of type %d.",
            node->opcode );
        return FALSE;
    }

    bf_put_uint16_be( bfile, node->opcode );
    bf_put_uint16_be( bfile, node->length );

    pos = 4;
    do {
        node_data * data;
        data = (node_data *) node->data;

        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->material_index ); pos += 4;
        if ( node->length < (pos + 12) ) break;
        bf_write( bfile, (uint8_t *) data->name, 12 ); pos += 12;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->flags ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->ambient_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->diffuse_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->specular_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_red ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_green ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->emissive_blue ); pos += 4;

        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->shininess ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_float32_be( bfile, data->alpha ); pos += 4;
        if ( node->length < (pos + 4) ) break;
        bf_put_uint32_be( bfile, data->spare ); pos += 4;
    } while ( FALSE );

    if ( node->length > pos )
        pos += bf_write( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}